

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Node * __thiscall rw::ColorQuant::findNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  uint32 a;
  int32 level_local;
  uint32 addr_local;
  Node *root_local;
  ColorQuant *this_local;
  
  this_local = (ColorQuant *)root;
  if ((level != 0) && (root->children[addr & 0xf] != (Node *)0x0)) {
    this_local = (ColorQuant *)findNode(this,root->children[addr & 0xf],addr >> 4,level + -1);
  }
  return (Node *)this_local;
}

Assistant:

ColorQuant::Node*
ColorQuant::findNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil)
		return root;

	return this->findNode(root->children[a], addr>>4, level-1);
}